

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void obfree(obj *obj,obj *merge)

{
  undefined8 uVar1;
  bill_x *pbVar2;
  bill_x *pbVar3;
  undefined8 *puVar4;
  monst *local_30;
  monst *shkp;
  bill_x *bpm;
  bill_x *bp;
  obj *merge_local;
  obj *obj_local;
  
  if ((obj->otyp == 0xf1) && (obj->corpsenm != 0)) {
    o_unleash(obj);
  }
  if (obj->oclass == '\a') {
    food_disappears(obj);
  }
  if (obj->oclass == '\n') {
    book_disappears(obj);
  }
  if (obj->cobj != (obj *)0x0) {
    delete_contents(obj);
  }
  local_30 = (monst *)0x0;
  if ((*(uint *)&obj->field_0x4a >> 2 & 1) != 0) {
    local_30 = next_shkp(level->monlist,'\x01');
    while ((local_30 != (monst *)0x0 &&
           (pbVar2 = onbill(obj,local_30,'\x01'), pbVar2 == (bill_x *)0x0))) {
      local_30 = next_shkp(local_30->nmon,'\x01');
    }
  }
  if (local_30 == (monst *)0x0) {
    local_30 = shop_keeper(level,u.ushops[0]);
  }
  pbVar2 = onbill(obj,local_30,'\0');
  if (pbVar2 != (bill_x *)0x0) {
    if (merge == (obj *)0x0) {
      pbVar2->useup = '\x01';
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffffb;
      add_to_billobjs(obj);
      return;
    }
    pbVar3 = onbill(merge,local_30,'\0');
    if (pbVar3 == (bill_x *)0x0) {
      warning("obfree: not on bill??");
      return;
    }
    pbVar3->bquan = pbVar2->bquan + pbVar3->bquan;
    *(short *)((long)&local_30[0x1b].misc_worn_check + 2) =
         *(short *)((long)&local_30[0x1b].misc_worn_check + 2) + -1;
    puVar4 = (undefined8 *)
             (*(long *)&local_30[0x1b].mnum +
             (long)*(short *)((long)&local_30[0x1b].misc_worn_check + 2) * 0x10);
    uVar1 = *puVar4;
    pbVar2->bo_id = (int)uVar1;
    pbVar2->useup = (char)((ulong)uVar1 >> 0x20);
    *(int3 *)&pbVar2->field_0x5 = (int3)((ulong)uVar1 >> 0x28);
    uVar1 = puVar4[1];
    pbVar2->price = (int)uVar1;
    pbVar2->bquan = (int)((ulong)uVar1 >> 0x20);
  }
  if (obj == uwep) {
    uwepgone();
  }
  if (obj == uswapwep) {
    uswapwepgone();
  }
  if (obj == uquiver) {
    uqwepgone();
  }
  dealloc_obj(obj);
  return;
}

Assistant:

void obfree(struct obj *obj, struct obj *merge)
{
	struct bill_x *bp;
	struct bill_x *bpm;
	struct monst *shkp;

	if (obj->otyp == LEASH && obj->leashmon) o_unleash(obj);
	if (obj->oclass == FOOD_CLASS) food_disappears(obj);
	if (obj->oclass == SPBOOK_CLASS) book_disappears(obj);
	if (Has_contents(obj)) delete_contents(obj);

	shkp = 0;
	if (obj->unpaid) {
	    /* look for a shopkeeper who owns this object */
	    for (shkp = next_shkp(level->monlist, TRUE); shkp;
		    shkp = next_shkp(shkp->nmon, TRUE))
		if (onbill(obj, shkp, TRUE)) break;
	}
	/* sanity check, more or less */
	if (!shkp) shkp = shop_keeper(level, *u.ushops);
		/*
		 * Note:  `shkp = shop_keeper(level, *u.ushops)' used to be
		 *	  unconditional.  But obfree() is used all over
		 *	  the place, so making its behavior be dependent
		 *	  upon player location doesn't make much sense.
		 */

	if ((bp = onbill(obj, shkp, FALSE)) != 0) {
		if (!merge){
			bp->useup = 1;
			obj->unpaid = 0;	/* only for doinvbill */
			add_to_billobjs(obj);
			return;
		}
		bpm = onbill(merge, shkp, FALSE);
		if (!bpm){
			/* this used to be a rename */
			warning("obfree: not on bill??");
			return;
		} else {
			/* this was a merger */
			bpm->bquan += bp->bquan;
			ESHK(shkp)->billct--;
			*bp = ESHK(shkp)->bill_p[ESHK(shkp)->billct];
			
		}
	}
	
	if (obj == uwep) uwepgone();
	if (obj == uswapwep) uswapwepgone();
	if (obj == uquiver) uqwepgone();
	
	dealloc_obj(obj);
}